

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumOneofFieldGenerator::GenerateConstructorCode
          (EnumOneofFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  EnumOneofFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter
            ((Formatter *)local_50,printer,
             &(this->super_EnumFieldGenerator).super_FieldGenerator.variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,"$ns$::_$classname$_default_instance_.$name$_ = $default$;\n");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void EnumOneofFieldGenerator::GenerateConstructorCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("$ns$::_$classname$_default_instance_.$name$_ = $default$;\n");
}